

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

void __thiscall VcprojGenerator::~VcprojGenerator(VcprojGenerator *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  (this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
  _vptr_QMakeSourceFileInfo = (_func_int **)&PTR_fixPathForFile_002dff28;
  if (this->projectWriter != (VCProjectWriter *)0x0) {
    (*this->projectWriter->_vptr_VCProjectWriter[1])();
  }
  pDVar1 = (this->mergedProjects).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->mergedProjects).d.d)->super_QArrayData,8,0x10);
    }
  }
  VCProjectSingleConfig::~VCProjectSingleConfig(&this->vcProject);
  pDVar2 = (this->customBuildToolFilterFileSuffix).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&((this->customBuildToolFilterFileSuffix).d.d)->super_QArrayData,2,0x10);
    }
  }
  QHash<QString,_QString>::~QHash(&this->extraCompilerOutputs);
  QHash<QString,_QList<QString>_>::~QHash(&this->extraCompilerSources);
  pDVar2 = (this->precompPch).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->precompPch).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->precompObj).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->precompObj).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->precompSource).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->precompSource).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->precompHFilename).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->precompHFilename).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->precompH).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->precompH).d.d)->super_QArrayData,2,0x10);
    }
  }
  MakefileGenerator::~MakefileGenerator((MakefileGenerator *)this);
  return;
}

Assistant:

VcprojGenerator::~VcprojGenerator()
{
    delete projectWriter;
}